

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PArena.cpp
# Opt level: O0

void __thiscall amrex::PArena::PArena(PArena *this,Long release_threshold)

{
  undefined8 *in_RDI;
  
  Arena::Arena((Arena *)0x123b93d);
  *in_RDI = &PTR__PArena_01aa3ac0;
  return;
}

Assistant:

PArena::PArena (Long release_threshold)
{
#ifdef AMREX_CUDA_GE_11_2
    if (Gpu::Device::memoryPoolsSupported()) {
        AMREX_CUDA_SAFE_CALL(cudaDeviceGetMemPool(&m_pool, Gpu::Device::deviceId()));
        AMREX_CUDA_SAFE_CALL(cudaMemPoolGetAttribute(m_pool, cudaMemPoolAttrReleaseThreshold,
                                                     &m_old_release_threshold));
        cuuint64_t value = release_threshold;
        AMREX_CUDA_SAFE_CALL(cudaMemPoolSetAttribute(m_pool, cudaMemPoolAttrReleaseThreshold, &value));
    }
#endif
    amrex::ignore_unused(release_threshold);
}